

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_abstractmodelserialiser.cpp
# Opt level: O0

void AbstractModelSerialiser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QList<int> *this;
  undefined8 *puVar1;
  byte bVar2;
  Version VVar3;
  int iVar4;
  QList<int> *pQVar5;
  Data *pDVar6;
  AbstractModelSerialiser *_t_3;
  void *_v_1;
  AbstractModelSerialiser *_t_2;
  void *_v;
  AbstractModelSerialiser *_t_1;
  bool _r_4;
  bool _r_3;
  bool _r_2;
  bool _r_1;
  Version _r;
  AbstractModelSerialiser *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      setStreamVersion((AbstractModelSerialiser *)_o,*_a[1]);
      break;
    case 1:
      (**(code **)(*(long *)_o + 0x70))(_o,*_a[1]);
      break;
    case 2:
      (**(code **)(*(long *)_o + 0x78))(_o,*_a[1]);
      break;
    case 3:
      (**(code **)(*(long *)_o + 0x80))();
      break;
    case 4:
      VVar3 = streamVersion((AbstractModelSerialiser *)_o);
      if (*_a != (void *)0x0) {
        *(Version *)*_a = VVar3;
      }
      break;
    case 5:
      bVar2 = (**(code **)(*(long *)_o + 0xa0))(_o,*_a[1]);
      if (*_a != (void *)0x0) {
        *(byte *)*_a = bVar2 & 1;
      }
      break;
    case 6:
      bVar2 = (**(code **)(*(long *)_o + 0xa8))(_o,*_a[1]);
      if (*_a != (void *)0x0) {
        *(byte *)*_a = bVar2 & 1;
      }
      break;
    case 7:
      bVar2 = (**(code **)(*(long *)_o + 0xb0))(_o,*_a[1]);
      if (*_a != (void *)0x0) {
        *(byte *)*_a = bVar2 & 1;
      }
      break;
    case 8:
      bVar2 = (**(code **)(*(long *)_o + 0xb8))(_o,_a[1]);
      if (*_a != (void *)0x0) {
        *(byte *)*_a = bVar2 & 1;
      }
    }
  }
  else if (_c == RegisterPropertyMetaType) {
    if (_id == 0) {
      iVar4 = qRegisterMetaType<QList<int>>();
      *(int *)*_a = iVar4;
    }
    else if (_id == 1) {
      iVar4 = qRegisterMetaType<QAbstractItemModel*>();
      *(int *)*_a = iVar4;
    }
    else {
      *(undefined4 *)*_a = 0xffffffff;
    }
  }
  else if (_c == ReadProperty) {
    this = (QList<int> *)*_a;
    if (_id == 0) {
      pQVar5 = (QList<int> *)(**(code **)(*(long *)_o + 0x60))();
      QList<int>::operator=(this,pQVar5);
    }
    else if (_id == 1) {
      pDVar6 = (Data *)(**(code **)(*(long *)_o + 0x90))();
      (this->d).d = pDVar6;
    }
    else if (_id == 2) {
      pDVar6 = (Data *)(**(code **)(*(long *)_o + 0x98))();
      (this->d).d = pDVar6;
    }
  }
  else if (_c == WriteProperty) {
    puVar1 = (undefined8 *)*_a;
    if (_id == 0) {
      (**(code **)(*(long *)_o + 0x68))(_o,puVar1);
    }
    else if (_id == 1) {
      setModel((AbstractModelSerialiser *)_o,(QAbstractItemModel *)*puVar1);
    }
    else if (_id == 2) {
      setModel((AbstractModelSerialiser *)_o,(QAbstractItemModel *)*puVar1);
    }
  }
  else if ((_c == ResetProperty) && (_id == 0)) {
    (**(code **)(*(long *)_o + 0x88))();
  }
  return;
}

Assistant:

void AbstractModelSerialiser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<AbstractModelSerialiser *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->setStreamVersion((*reinterpret_cast< std::add_pointer_t<QDataStream::Version>>(_a[1]))); break;
        case 1: _t->addRoleToSave((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->removeRoleToSave((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->clearRoleToSave(); break;
        case 4: { QDataStream::Version _r = _t->streamVersion();
            if (_a[0]) *reinterpret_cast< QDataStream::Version*>(_a[0]) = std::move(_r); }  break;
        case 5: { bool _r = _t->saveModel((*reinterpret_cast< std::add_pointer_t<QIODevice*>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 6: { bool _r = _t->saveModel((*reinterpret_cast< std::add_pointer_t<QByteArray*>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 7: { bool _r = _t->loadModel((*reinterpret_cast< std::add_pointer_t<QIODevice*>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 8: { bool _r = _t->loadModel((*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 1:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QAbstractItemModel* >(); break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QList<int> >(); break;
        }
    }

#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<AbstractModelSerialiser *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QList<int>*>(_v) = _t->rolesToSave(); break;
        case 1: *reinterpret_cast< QAbstractItemModel**>(_v) = _t->model(); break;
        case 2: *reinterpret_cast< const QAbstractItemModel**>(_v) = _t->constModel(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<AbstractModelSerialiser *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setRoleToSave(*reinterpret_cast< QList<int>*>(_v)); break;
        case 1: _t->setModel(*reinterpret_cast< QAbstractItemModel**>(_v)); break;
        case 2: _t->setModel(*reinterpret_cast< const QAbstractItemModel**>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
        auto *_t = static_cast<AbstractModelSerialiser *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->resetRoleToSave(); break;
        default: break;
        }
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}